

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O0

void duckdb::RollbackUpdate<duckdb::interval_t>(UpdateInfo *base_info,UpdateInfo *rollback_info)

{
  int32_t iVar1;
  interval_t *piVar2;
  sel_t *psVar3;
  interval_t *piVar4;
  sel_t *psVar5;
  interval_t *piVar6;
  interval_t *piVar7;
  long in_RSI;
  sel_t id;
  idx_t i;
  idx_t base_offset;
  sel_t *rollback_tuples;
  interval_t *rollback_data;
  sel_t *base_tuples;
  interval_t *base_data;
  ulong local_40;
  long local_38;
  
  piVar2 = UpdateInfo::GetData<duckdb::interval_t>((UpdateInfo *)0xbc2708);
  psVar3 = UpdateInfo::GetTuples((UpdateInfo *)0xbc2717);
  piVar4 = UpdateInfo::GetData<duckdb::interval_t>((UpdateInfo *)0xbc2726);
  psVar5 = UpdateInfo::GetTuples((UpdateInfo *)0xbc2735);
  local_38 = 0;
  for (local_40 = 0; local_40 < *(uint *)(in_RSI + 0x20); local_40 = local_40 + 1) {
    for (; psVar3[local_38] < psVar5[local_40]; local_38 = local_38 + 1) {
    }
    piVar7 = piVar4 + local_40;
    piVar6 = piVar2 + local_38;
    iVar1 = piVar7->days;
    piVar6->months = piVar7->months;
    piVar6->days = iVar1;
    piVar6->micros = piVar7->micros;
  }
  return;
}

Assistant:

static void RollbackUpdate(UpdateInfo &base_info, UpdateInfo &rollback_info) {
	auto base_data = base_info.GetData<T>();
	auto base_tuples = base_info.GetTuples();
	auto rollback_data = rollback_info.GetData<T>();
	auto rollback_tuples = rollback_info.GetTuples();
	idx_t base_offset = 0;
	for (idx_t i = 0; i < rollback_info.N; i++) {
		auto id = rollback_tuples[i];
		while (base_tuples[base_offset] < id) {
			base_offset++;
			D_ASSERT(base_offset < base_info.N);
		}
		base_data[base_offset] = rollback_data[i];
	}
}